

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iostream-test.c++
# Opt level: O1

void __thiscall kj::std::anon_unknown_0::TestCase56::run(TestCase56 *this)

{
  char buf [9];
  StdInputStream in;
  StdOutputStream out;
  stringstream ss;
  undefined4 local_1b9;
  char acStack_1b5 [2];
  char local_1b3;
  BufferedInputStream local_1b0;
  stringstream *local_1a8;
  undefined1 local_1a0 [32];
  uchar local_180 [112];
  ios_base local_110 [264];
  
  ::std::__cxx11::stringstream::stringstream((stringstream *)(local_1a0 + 0x10));
  local_1b0.super_InputStream._vptr_InputStream = (InputStream)&PTR__BufferedInputStream_001c20c8;
  local_1a0._8_8_ = local_180;
  local_1a0._0_8_ = &PTR__ArrayOutputStream_001c2110;
  local_1a8 = (stringstream *)(local_1a0 + 0x10);
  ::std::ostream::write((char *)local_1a0._8_8_,0x18bf9e);
  ::std::istream::read((char *)local_1a8,(long)&local_1b9);
  local_1b3 = '\0';
  if ((CONCAT21(acStack_1b5,local_1b9._3_1_) != 0x726162 || local_1b9 != 0x626f6f66) &&
     (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[46],char_const(&)[7],char(&)[9]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/std/iostream-test.c++"
               ,0x48,ERROR,
               "\"failed: expected \" \"::strcmp(\\\"foobar\\\", buf) == 0\", \"foobar\", buf",
               (char (*) [46])"failed: expected ::strcmp(\"foobar\", buf) == 0",
               (char (*) [7])"foobar",(char (*) [9])&local_1b9);
  }
  ArrayOutputStream::~ArrayOutputStream((ArrayOutputStream *)local_1a0);
  BufferedInputStream::~BufferedInputStream(&local_1b0);
  ::std::__cxx11::stringstream::~stringstream((stringstream *)(local_1a0 + 0x10));
  ::std::ios_base::~ios_base(local_110);
  return;
}

Assistant:

TEST(StdIoStream, TryReadToEndOfFile) {
  // Check that tryRead works when eof is reached before minBytes.

  ::std::stringstream ss;

  StdInputStream in(ss);
  StdOutputStream out(ss);

  const void* bytes = "foobar";

  out.write(bytes, 6);

  char buf[9];
  in.tryRead(buf, 8, 8);
  buf[6] = '\0';

  EXPECT_STREQ("foobar", buf);
}